

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int crec_call(jit_State *J,RecordFFData *rd,GCcdata *cd)

{
  ushort uVar1;
  IRRef1 IVar2;
  TRef TVar3;
  IRType IVar4;
  int iVar5;
  TRef TVar6;
  CTState *cts_00;
  cTValue *pcVar7;
  long in_RDX;
  long in_RSI;
  jit_State *in_RDI;
  TRef trid;
  TValue tv;
  TRef tr;
  IRType t;
  CType *ctr;
  TRef func;
  IRType tp;
  CType *ct;
  CTState *cts;
  CType *ct_1;
  TraceError in_stack_fffffffffffffdfc;
  jit_State *in_stack_fffffffffffffe00;
  jit_State *pjVar8;
  undefined4 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined2 in_stack_fffffffffffffe0e;
  jit_State *in_stack_fffffffffffffe10;
  jit_State *J_00;
  jit_State *in_stack_fffffffffffffe20;
  undefined2 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2a;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe38;
  IRRef1 local_1b8;
  CType *local_1b0;
  int local_184;
  CType *local_180;
  CType *local_168;
  CType *local_158;
  CTState *in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffeba;
  undefined2 in_stack_fffffffffffffebc;
  undefined2 in_stack_fffffffffffffebe;
  RecordFFData *in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffeca;
  undefined2 in_stack_fffffffffffffecc;
  undefined2 in_stack_fffffffffffffece;
  ulong local_8;
  
  cts_00 = (CTState *)(ulong)in_RDI[-1].bpropcache[0xc].mode;
  for (local_180 = cts_00->tab + *(ushort *)(in_RDX + 6); local_180->info >> 0x1c == 8;
      local_180 = cts_00->tab + (local_180->info & 0xffff)) {
  }
  local_1b0 = local_180;
  uVar1 = 9;
  if (local_180->info >> 0x1c == 2) {
    uVar1 = 5;
    if (local_180->size == 8) {
      uVar1 = 9;
    }
    local_158 = local_180;
    do {
      local_1b0 = cts_00->tab + (local_158->info & 0xffff);
      local_158 = local_1b0;
      in_stack_fffffffffffffeb0 = cts_00;
    } while (local_1b0->info >> 0x1c == 8);
  }
  if (local_1b0->info >> 0x1c == 6) {
    TVar3 = *in_RDI->base;
    (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4400;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (in_RDI->fold).ins.field_0.op2 = 0xf;
    TVar3 = lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffe0e,
                                 CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
    local_1b8 = (IRRef1)TVar3;
    local_168 = local_1b0;
    do {
      local_168 = cts_00->tab + (local_168->info & 0xffff);
    } while (local_168->info >> 0x1c == 8);
    IVar4 = crec_ct2irt(cts_00,local_168);
    iVar5 = 4;
    if (uVar1 == 9) {
      iVar5 = 8;
    }
    if (iVar5 == 4) {
      local_8 = (ulong)*(uint *)(in_RDX + 8);
    }
    else {
      local_8 = *(ulong *)(in_RDX + 8);
    }
    pcVar7 = lj_tab_get((lua_State *)CONCAT44(IVar4,in_stack_fffffffffffffe38),
                        (GCtab *)(local_8 >> 2),
                        (cTValue *)
                        CONCAT44(in_stack_fffffffffffffe2c,
                                 CONCAT22(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28)));
    if ((pcVar7->field_2).it == 0xfffffffd) {
      lj_trace_err(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    }
    if (local_168->info >> 0x1c == 4) {
      IVar4 = IRT_NIL;
      *(undefined8 *)(in_RSI + 8) = 0;
    }
    else if ((((local_168->info >> 0x1c != 0) && (local_168->info >> 0x1c != 2)) &&
             (local_168->info >> 0x1c != 5)) || (IVar4 == IRT_CDATA)) {
      lj_trace_err(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    }
    if ((local_1b0->info & 0x800000) != 0) {
      in_stack_fffffffffffffe20 = in_RDI;
      TVar3 = lj_ir_kint(in_stack_fffffffffffffe10,
                         CONCAT22(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c));
      (in_stack_fffffffffffffe20->fold).ins.field_0.ot = 0x6200;
      (in_stack_fffffffffffffe20->fold).ins.field_0.op1 = local_1b8;
      (in_stack_fffffffffffffe20->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar3 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_fffffffffffffe0e,
                                   CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
      local_1b8 = (IRRef1)TVar3;
    }
    uVar1 = (ushort)IVar4;
    J_00 = in_RDI;
    TVar3 = crec_call_args((jit_State *)
                           CONCAT26(in_stack_fffffffffffffece,
                                    CONCAT24(in_stack_fffffffffffffecc,
                                             CONCAT22(in_stack_fffffffffffffeca,
                                                      in_stack_fffffffffffffec8))),
                           in_stack_fffffffffffffec0,
                           (CTState *)
                           CONCAT26(in_stack_fffffffffffffebe,
                                    CONCAT24(in_stack_fffffffffffffebc,
                                             CONCAT22(in_stack_fffffffffffffeba,
                                                      in_stack_fffffffffffffeb8))),
                           (CType *)in_stack_fffffffffffffeb0);
    (J_00->fold).ins.field_0.ot = uVar1 | 0x6100;
    (J_00->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J_00->fold).ins.field_0.op2 = local_1b8;
    TVar3 = lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffe0e,
                                 CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
    if ((local_168->info & 0xf8000000) == 0x8000000) {
      if ((((ulong)*in_RDI->L->base & 0x300000000) == 0) &&
         (*(uint *)((ulong)*(uint *)((long)in_RDI->L->base + -4) - 4) >> 0x18 == 1)) {
        TVar3 = 0x7fff;
      }
      else {
        crec_snap_caller(in_stack_fffffffffffffe20);
        IVar2 = (IRRef1)TVar3;
        pjVar8 = in_RDI;
        TVar3 = lj_ir_kint(J_00,CONCAT22(IVar2,in_stack_fffffffffffffe0c));
        (pjVar8->fold).ins.field_0.ot = 0x990;
        (pjVar8->fold).ins.field_0.op1 = IVar2;
        (pjVar8->fold).ins.field_0.op2 = (IRRef1)TVar3;
        in_RDI->postproc = LJ_POST_FIXGUARDSNAP;
        TVar3 = 0x2007ffd;
      }
    }
    else if (((IVar4 == IRT_P64) || (IVar4 == IRT_P32)) ||
            ((IVar4 == IRT_I64 || ((IVar4 == IRT_U64 || (local_168->info >> 0x1c == 5)))))) {
      TVar6 = lj_ir_kint(J_00,CONCAT22(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c));
      (in_RDI->fold).ins.field_0.ot = 0x528a;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar3 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_fffffffffffffe0e,
                                   CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
    }
    else {
      IVar2 = (IRRef1)TVar3;
      uVar1 = (ushort)IVar4;
      if ((IVar4 == IRT_FLOAT) || (IVar4 == IRT_U32)) {
        (in_RDI->fold).ins.field_0.ot = 0x590e;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = uVar1 | 0x1c0;
        TVar3 = lj_opt_fold((jit_State *)
                            CONCAT26(in_stack_fffffffffffffe0e,
                                     CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)))
        ;
      }
      else if ((IVar4 == IRT_I8) || (IVar4 == IRT_I16)) {
        (in_RDI->fold).ins.field_0.ot = 0x5913;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = uVar1 | 0xa60;
        TVar3 = lj_opt_fold((jit_State *)
                            CONCAT26(in_stack_fffffffffffffe0e,
                                     CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)))
        ;
      }
      else if ((IVar4 == IRT_U8) || (IVar4 == IRT_U16)) {
        (in_RDI->fold).ins.field_0.ot = 0x5913;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = uVar1 | 0x260;
        TVar3 = lj_opt_fold((jit_State *)
                            CONCAT26(in_stack_fffffffffffffe0e,
                                     CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)))
        ;
      }
    }
    *in_RDI->base = TVar3;
    in_RDI->needsnap = '\x01';
    local_184 = 1;
  }
  else {
    local_184 = 0;
  }
  return local_184;
}

Assistant:

static int crec_call(jit_State *J, RecordFFData *rd, GCcdata *cd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  IRType tp = IRT_PTR;
  if (ctype_isptr(ct->info)) {
    tp = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    TRef func = emitir(IRT(IR_FLOAD, tp), J->base[0], IRFL_CDATA_PTR);
    CType *ctr = ctype_rawchild(cts, ct);
    IRType t = crec_ct2irt(cts, ctr);
    TRef tr;
    TValue tv;
    /* Check for blacklisted C functions that might call a callback. */
    tv.u64 = ((uintptr_t)cdata_getptr(cdataptr(cd), (LJ_64 && tp == IRT_P64) ? 8 : 4) >> 2) | U64x(800000000, 00000000);
    if (tvistrue(lj_tab_get(J->L, cts->miscmap, &tv)))
      lj_trace_err(J, LJ_TRERR_BLACKL);
    if (ctype_isvoid(ctr->info)) {
      t = IRT_NIL;
      rd->nres = 0;
    } else if (!(ctype_isnum(ctr->info) || ctype_isptr(ctr->info) ||
		 ctype_isenum(ctr->info)) || t == IRT_CDATA) {
      lj_trace_err(J, LJ_TRERR_NYICALL);
    }
    if ((ct->info & CTF_VARARG)
#if LJ_TARGET_X86
	|| ctype_cconv(ct->info) != CTCC_CDECL
#endif
	)
      func = emitir(IRT(IR_CARG, IRT_NIL), func,
		    lj_ir_kint(J, ctype_typeid(cts, ct)));
    tr = emitir(IRT(IR_CALLXS, t), crec_call_args(J, rd, cts, ct), func);
    if (ctype_isbool(ctr->info)) {
      if (frame_islua(J->L->base-1) && bc_b(frame_pc(J->L->base-1)[-1]) == 1) {
	/* Don't check result if ignored. */
	tr = TREF_NIL;
      } else {
	crec_snap_caller(J);
#if LJ_TARGET_X86ORX64
	/* Note: only the x86/x64 backend supports U8 and only for EQ(tr, 0). */
	lj_ir_set(J, IRTG(IR_NE, IRT_U8), tr, lj_ir_kint(J, 0));
#else
	lj_ir_set(J, IRTGI(IR_NE), tr, lj_ir_kint(J, 0));
#endif
	J->postproc = LJ_POST_FIXGUARDSNAP;
	tr = TREF_TRUE;
      }
    } else if (t == IRT_PTR || (LJ_64 && t == IRT_P32) ||
	       t == IRT_I64 || t == IRT_U64 || ctype_isenum(ctr->info)) {
      TRef trid = lj_ir_kint(J, ctype_cid(ct->info));
      tr = emitir(IRTG(IR_CNEWI, IRT_CDATA), trid, tr);
      if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
    } else if (t == IRT_FLOAT || t == IRT_U32) {
      tr = emitconv(tr, IRT_NUM, t, 0);
    } else if (t == IRT_I8 || t == IRT_I16) {
      tr = emitconv(tr, IRT_INT, t, IRCONV_SEXT);
    } else if (t == IRT_U8 || t == IRT_U16) {
      tr = emitconv(tr, IRT_INT, t, 0);
    }
    J->base[0] = tr;
    J->needsnap = 1;
    return 1;
  }
  return 0;
}